

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

void registerPlugins(PluginManager *manager)

{
  allocator local_29;
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,"/std/vector",&local_29);
  Typelib::Container::registerContainer(local_28,Vector::factory);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string(local_28,"/std/string",&local_29);
  Typelib::Container::registerContainer(local_28,String::factory);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void registerPlugins(Typelib::PluginManager& manager)
{
    Typelib::Container::registerContainer("/std/vector", Vector::factory);
    Typelib::Container::registerContainer("/std/string", String::factory);
}